

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HApp.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  ostream *poVar13;
  char *pcVar14;
  bool bVar15;
  double dStack_15d20;
  char *pcStack_15d00;
  char *pcStack_15cf8;
  char *pcStack_15cf0;
  double dStack_15ce8;
  char *pcStack_15ce0;
  char *pcStack_15cd8;
  HModel model;
  HTester tester;
  
  poVar13 = std::operator<<((ostream *)&std::cout,
                            "===================================================================================="
                           );
  std::endl<char,std::char_traits<char>>(poVar13);
  poVar13 = std::operator<<((ostream *)&std::cout,"Running hsol");
  std::endl<char,std::char_traits<char>>(poVar13);
  if ((argc == 4) && (iVar11 = strcmp(argv[1],"-repeat"), iVar11 == 0)) {
    HTester::HTester(&tester);
    HTester::setup((char *)&tester);
    atoi(argv[3]);
    HTester::testUpdate((int)&tester);
    HTester::~HTester(&tester);
    return 0;
  }
  dStack_15ce8 = 1e+200;
  dStack_15d20 = 0.0;
  bVar15 = false;
  pcStack_15cf0 = "";
  pcStack_15d00 = "";
  pcStack_15cd8 = "";
  pcStack_15cf8 = "";
  pcStack_15ce0 = (char *)0x0;
  bVar1 = false;
  bVar8 = false;
  bVar3 = false;
  bVar4 = false;
  bVar9 = false;
  bVar6 = false;
  bVar7 = false;
switchD_00104758_caseD_73:
  bVar5 = bVar9;
  bVar10 = bVar8;
  iVar11 = getopt(argc,argv,"p:c:e:sSm::t:T:df:");
  bVar2 = true;
  bVar8 = bVar2;
  bVar9 = bVar5;
  switch(iVar11) {
  case 99:
    pcStack_15cf8 = _optarg;
    poVar13 = std::operator<<((ostream *)&std::cout,"Crash is set to ");
    poVar13 = std::operator<<(poVar13,_optarg);
    std::endl<char,std::char_traits<char>>(poVar13);
    bVar8 = bVar10;
    bVar6 = bVar2;
    goto switchD_00104758_caseD_73;
  case 100:
    debug = 1;
    bVar8 = bVar10;
    goto switchD_00104758_caseD_73;
  case 0x65:
    pcStack_15d00 = _optarg;
    poVar13 = std::operator<<((ostream *)&std::cout,"Edge weight is set to ");
    poVar13 = std::operator<<(poVar13,_optarg);
    std::endl<char,std::char_traits<char>>(poVar13);
    bVar8 = bVar10;
    bVar7 = bVar2;
    goto switchD_00104758_caseD_73;
  case 0x66:
    poVar13 = std::operator<<((ostream *)&std::cout,"Reading file ");
    poVar13 = std::operator<<(poVar13,_optarg);
    std::endl<char,std::char_traits<char>>(poVar13);
    pcStack_15cd8 = _optarg;
    bVar1 = bVar2;
    bVar8 = bVar10;
    goto switchD_00104758_caseD_73;
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6e:
  case 0x6f:
  case 0x71:
  case 0x72:
    goto switchD_00104758_caseD_67;
  case 0x6d:
    bVar8 = bVar10;
    bVar3 = bVar2;
    if (_optarg != (char *)0x0) {
      dStack_15d20 = atof(_optarg);
      std::operator<<((ostream *)&std::cout,"Pami cutoff = ");
      poVar13 = std::ostream::_M_insert<double>(dStack_15d20);
      std::endl<char,std::char_traits<char>>(poVar13);
    }
    goto switchD_00104758_caseD_73;
  case 0x70:
    bVar15 = false;
    if (*_optarg == 'O') {
      bVar15 = _optarg[1] == 'n';
    }
    pcStack_15cf0 = _optarg;
    pcVar14 = "Presolve is set to ";
    break;
  case 0x73:
    goto switchD_00104758_caseD_73;
  case 0x74:
    pcStack_15ce0 = _optarg;
    pcVar14 = "Partition file is set to ";
    break;
  default:
    goto switchD_00104758_default;
  }
  poVar13 = std::operator<<((ostream *)&std::cout,pcVar14);
  poVar13 = std::operator<<(poVar13,_optarg);
  std::endl<char,std::char_traits<char>>(poVar13);
  bVar8 = bVar10;
  goto switchD_00104758_caseD_73;
switchD_00104758_default:
  bVar8 = bVar10;
  bVar9 = bVar2;
  if (iVar11 != 0x53) {
    if (iVar11 != 0x54) {
      if (iVar11 == -1) {
        if (!bVar1) {
          pcStack_15cd8 = "ml.mps";
          printf("Setting default value filenameMode = %s\n","ml.mps");
        }
        if (!bVar15) {
          pcStack_15cf0 = "Off";
          printf("Setting default value presolveMode = %s\n");
        }
        if (!bVar6) {
          pcStack_15cf8 = "Off";
          printf("Setting default value crashMode = %s\n");
        }
        if (!bVar7) {
          pcStack_15d00 = "DSE1";
          printf("Setting default value edWtMode = %s\n");
        }
        if (bVar10) {
          solveTasks(pcStack_15cd8);
        }
        if (bVar5) {
          solveSCIP(pcStack_15cd8);
          return 0;
        }
        if (bVar3) {
          if (pcStack_15ce0 != (char *)0x0) {
            solveMulti(pcStack_15cd8,pcStack_15ce0);
            return 0;
          }
          if ((dStack_15d20 == 0.0) && (!NAN(dStack_15d20))) {
            solveMulti(pcStack_15cd8,(char *)0x0);
            return 0;
          }
          HModel::HModel(&model);
          _model = 1;
          iVar11 = HModel::load_fromMPS((char *)&model);
          if (iVar11 == 0) {
            HModel::scaleModel();
            HDual::HDual((HDual *)&tester);
            HDual::solve((HModel *)&tester,(int)&model,2);
            HModel::util_reportSolverOutcome((char *)&model);
            HDual::~HDual((HDual *)&tester);
            HModel::~HModel(&model);
            return 0;
          }
          HModel::~HModel(&model);
          return iVar11;
        }
        if (((!bVar7 && !bVar6) && !bVar15) && !bVar4) {
          uVar12 = solvePlain(pcStack_15cd8);
          if (uVar12 == 0) {
            return 0;
          }
          printf("solvePlain(API) return code is %d\n",(ulong)uVar12);
          return 0;
        }
        if (((bVar7 || bVar6) || bVar4) || !bVar15) {
          solvePlainJAJH(pcStack_15d00,pcStack_15cf8,pcStack_15cf0,pcStack_15cd8,dStack_15ce8);
          return 0;
        }
        solvePlainWithPresolve(pcStack_15cd8);
        return 0;
      }
      if (iVar11 == 0x3f) {
        fprintf(_stderr,"usage: %s [options] -f fName.mps \n%s",*argv,
                "Options: \n  -p On(Off): use presolve\n  -c mode   : set crash mode to mode. Values:\n            : Off LTSSF LTSSF1 LTSSF2 LTSSF3 LTSSF4 LTSSF5 LTSSF6 LTSSF7\n  -e edWt   : set edge weight to edWt. Values: \n            : Dan Dvx DSE DSE0 DSE1\n\n  -s        : use option sip\n  -S        : use option SCIP (to test utilities)\n  -m [cut]  : use pami. Cutoff optional double value.\n  -t fName  : use pami with partition file fName  -T time   : use a time limit  -d        : debug mode on\n"
               );
      }
      goto switchD_00104758_caseD_67;
    }
    dStack_15ce8 = atof(_optarg);
    poVar13 = std::operator<<((ostream *)&std::cout,"Time limit is set to ");
    poVar13 = std::operator<<(poVar13,_optarg);
    std::endl<char,std::char_traits<char>>(poVar13);
    bVar4 = bVar2;
    bVar9 = bVar5;
  }
  goto switchD_00104758_caseD_73;
switchD_00104758_caseD_67:
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  abort();
}

Assistant:

int main(int argc, char **argv) {
  int opt, filename=0, presolve=0, crash=0, edgeWeight=0, pami=0, sip=0, scip=0, timeLimit=0;
	double cut = 0;
	const char * fileName = "";
	const char * presolveMode = "";
	const char * edWtMode = "";
	const char * crashMode= "";
	const char * partitionFile = 0;
	double TimeLimit_ArgV = HSOL_CONST_INF;

#ifdef JAJH_dev
	cout <<"===================================================================================="<<endl;
	cout <<"Running hsol"<<endl;
#else
	cout <<"===================================================================================="<<endl;
	cout <<"Running hsol"<<endl;
#endif

	if (argc == 4 && strcmp(argv[1], "-repeat")==0) {
#ifdef JAJH_dev
	  HTester tester;
	  tester.setup(argv[2]);
	  tester.testUpdate(atoi(argv[3]));
#endif
	  return 0;
        }
	
	while ((opt = getopt(argc,argv,"p:c:e:sSm::t:T:df:")) != EOF)
	  switch(opt)
	    {
	    case 'f':
	      filename = 1;
	      cout <<"Reading file "<< optarg <<endl;
	      fileName = optarg;
	      break;
	    case 'p':
	      presolveMode = optarg;
	      presolve = (presolveMode[0]=='O' && presolveMode[1]=='n') ? 1 : 0;
	      cout <<"Presolve is set to "<< optarg <<endl;
	      break;
	    case 's':
	      sip = 1;
	      break;
	    case 'S':
	      scip = 1;
	      break;
	    case 'm':
	      pami = 1;
	      if (optarg) {
		cut = atof(optarg);
		cout<< "Pami cutoff = "<< cut<<endl;
	      }
	      break;
	    case 'd':
	      debug = 1;
	      break;
            case 'c':
	      crash = 1;
	      crashMode = optarg;
	      cout <<"Crash is set to "<< optarg <<endl;
	      break;
            case 'e':
	      edgeWeight = 1;
	      edWtMode = optarg;
	      cout <<"Edge weight is set to "<< optarg <<endl;
	      break;
	    case 't':
	      partitionFile = optarg;
	      cout <<"Partition file is set to "<< optarg <<endl;
	      break;
	    case 'T':
	      timeLimit = 1;
	      TimeLimit_ArgV = atof(optarg);
	      cout <<"Time limit is set to "<< optarg <<endl;
	      break;
            case '?':
	      if (opt == 'p')
		fprintf (stderr, "Option -%c requires an argument. Current options: Off On \n", opt);
	      if (opt == 'c')
		fprintf (stderr, "Option -%c requires an argument. Current options: Off LTSSF LTSSF1 LTSSF2 LTSSF3 LTSSF4 LTSSF5 LTSSF6 \n", opt);
	      if (opt == 'e')
		fprintf (stderr, "Option -%c requires an argument. Current options: Dan Dvx DSE DSE0 DSE1 \n", opt);
	      else
		fprintf(stderr, "usage: %s [options] -f fName.mps \n%s", argv[0],
			"Options: \n"
			"  -p On(Off): use presolve\n"
			"  -c mode   : set crash mode to mode. Values:\n"
			"            : Off LTSSF LTSSF1 LTSSF2 LTSSF3 LTSSF4 LTSSF5 LTSSF6 LTSSF7\n"
			"  -e edWt   : set edge weight to edWt. Values: \n"
			"            : Dan Dvx DSE DSE0 DSE1\n\n"
			"  -s        : use option sip\n"
			"  -S        : use option SCIP (to test utilities)\n"
			"  -m [cut]  : use pami. Cutoff optional double value.\n"
			"  -t fName  : use pami with partition file fName"
			"  -T time   : use a time limit"
			"  -d        : debug mode on\n");
	    default:
	      cout<<endl;
	      abort();
	    }
	//Set defaults
     if (!filename) {
       fileName = "ml.mps";
       printf("Setting default value filenameMode = %s\n", fileName);
     }
     if (!presolve) {
       presolveMode = "Off";
       printf("Setting default value presolveMode = %s\n", presolveMode);
     }
     if (!crash) {
       crashMode = "Off";
       printf("Setting default value crashMode = %s\n", crashMode);
     }
     if (!edgeWeight) {
       edWtMode = "DSE1";
       printf("Setting default value edWtMode = %s\n", edWtMode);
     }
    //parallel
    if (sip)
      solveTasks(fileName);
    if (scip)
      solveSCIP(fileName);
    else if (pami) {
    	if (partitionFile)
    		solveMulti(fileName, partitionFile);
    	else if (cut) {
            HModel model;
            model.intOption[INTOPT_PRINT_FLAG] = 1;
            model.intOption[INTOPT_PERMUTE_FLAG] = 1;
            model.dblOption[DBLOPT_PAMI_CUTOFF] = cut;
	    int RtCd = model.load_fromMPS(fileName);
	    if (RtCd) return RtCd;

	    model.scaleModel();
            HDual solver;
            solver.solve(&model, HDUAL_VARIANT_MULTI, 8);

            model.util_reportSolverOutcome("Cut");
        }
    	else
			solveMulti(fileName);
    }
    //serial
    else {
      if (!presolve && !crash && !edgeWeight && !timeLimit) {
	int RtCod = 
	//solvePlainAPI(fileName);
			solvePlain(fileName);
	if (RtCod != 0) {
	  printf("solvePlain(API) return code is %d\n", RtCod);
	}
      }
      else if (presolve && !crash && !edgeWeight && !timeLimit) {
	solvePlainWithPresolve(fileName);
	//solvePlainExperiments(fileName);
	//testIO("fileIO");
      }
      else
	solvePlainJAJH(edWtMode, crashMode, presolveMode, fileName, TimeLimit_ArgV);
    }

    return 0;
}